

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O2

aom_metadata_array_t * aom_img_metadata_array_alloc(size_t sz)

{
  aom_metadata_array_t *arr;
  aom_metadata_t **ppaVar1;
  
  arr = (aom_metadata_array_t *)calloc(1,0x10);
  if (arr != (aom_metadata_array_t *)0x0) {
    if (sz == 0) {
      return arr;
    }
    ppaVar1 = (aom_metadata_t **)calloc(sz,8);
    arr->metadata_array = ppaVar1;
    if (ppaVar1 != (aom_metadata_t **)0x0) {
      arr->sz = sz;
      return arr;
    }
    aom_img_metadata_array_free(arr);
  }
  return (aom_metadata_array_t *)0x0;
}

Assistant:

aom_metadata_array_t *aom_img_metadata_array_alloc(size_t sz) {
  aom_metadata_array_t *arr =
      (aom_metadata_array_t *)calloc(1, sizeof(aom_metadata_array_t));
  if (!arr) return NULL;
  if (sz > 0) {
    arr->metadata_array =
        (aom_metadata_t **)calloc(sz, sizeof(aom_metadata_t *));
    if (!arr->metadata_array) {
      aom_img_metadata_array_free(arr);
      return NULL;
    }
    arr->sz = sz;
  }
  return arr;
}